

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugLogV(char *fmt,__va_list_tag *args)

{
  ImGuiContext *pIVar1;
  int iVar2;
  char *pcVar3;
  int old_size;
  ImGuiContext *g;
  __va_list_tag *args_local;
  char *fmt_local;
  
  pIVar1 = GImGui;
  iVar2 = ImGuiTextBuffer::size(&GImGui->DebugLogBuf);
  ImGuiTextBuffer::appendf(&pIVar1->DebugLogBuf,"[%05d] ",(ulong)(uint)pIVar1->FrameCount);
  ImGuiTextBuffer::appendfv(&pIVar1->DebugLogBuf,fmt,args);
  if ((pIVar1->DebugLogFlags & 0x400U) != 0) {
    pcVar3 = ImGuiTextBuffer::begin(&pIVar1->DebugLogBuf);
    printf("%s",pcVar3 + iVar2);
  }
  return;
}

Assistant:

void ImGui::DebugLogV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    const int old_size = g.DebugLogBuf.size();
    g.DebugLogBuf.appendf("[%05d] ", g.FrameCount);
    g.DebugLogBuf.appendfv(fmt, args);
    if (g.DebugLogFlags & ImGuiDebugLogFlags_OutputToTTY)
        IMGUI_DEBUG_PRINTF("%s", g.DebugLogBuf.begin() + old_size);
}